

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_parse_url_auth_option(SASL *sasl,char *value,size_t len)

{
  int iVar1;
  uint uVar2;
  size_t sStack_38;
  uint mechbit;
  size_t mechlen;
  size_t sStack_28;
  CURLcode result;
  size_t len_local;
  char *value_local;
  SASL *sasl_local;
  
  mechlen._4_4_ = CURLE_OK;
  if (len == 0) {
    sasl_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    if ((sasl->resetprefs & 1U) != 0) {
      sasl->resetprefs = false;
      sasl->prefmech = 0;
    }
    sStack_28 = len;
    len_local = (size_t)value;
    value_local = (char *)sasl;
    iVar1 = strncmp(value,"*",len);
    if (iVar1 == 0) {
      value_local[0x10] = -0x21;
      value_local[0x11] = -1;
      value_local[0x12] = -1;
      value_local[0x13] = -1;
    }
    else {
      uVar2 = Curl_sasl_decode_mech((char *)len_local,sStack_28,&stack0xffffffffffffffc8);
      if ((uVar2 == 0) || (sStack_38 != sStack_28)) {
        mechlen._4_4_ = CURLE_URL_MALFORMAT;
      }
      else {
        *(uint *)(value_local + 0x10) = uVar2 | *(uint *)(value_local + 0x10);
      }
    }
    sasl_local._4_4_ = mechlen._4_4_;
  }
  return sasl_local._4_4_;
}

Assistant:

CURLcode Curl_sasl_parse_url_auth_option(struct SASL *sasl,
                                         const char *value, size_t len)
{
  CURLcode result = CURLE_OK;
  size_t mechlen;

  if(!len)
    return CURLE_URL_MALFORMAT;

  if(sasl->resetprefs) {
    sasl->resetprefs = FALSE;
    sasl->prefmech = SASL_AUTH_NONE;
  }

  if(!strncmp(value, "*", len))
    sasl->prefmech = SASL_AUTH_DEFAULT;
  else {
    unsigned int mechbit = Curl_sasl_decode_mech(value, len, &mechlen);
    if(mechbit && mechlen == len)
      sasl->prefmech |= mechbit;
    else
      result = CURLE_URL_MALFORMAT;
  }

  return result;
}